

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindFileByName
          (MergedDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  uint uVar1;
  size_type sVar2;
  reference ppDVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int i;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::
            vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ::size((vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                    *)(in_RDI + 8));
    if (sVar2 <= (ulong)(long)local_24) {
      return false;
    }
    ppDVar3 = std::
              vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
              ::operator[]((vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                            *)(in_RDI + 8),(long)local_24);
    uVar1 = (*(*ppDVar3)->_vptr_DescriptorDatabase[2])(*ppDVar3,in_RSI,in_RDX);
    if ((uVar1 & 1) != 0) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool MergedDescriptorDatabase::FindFileByName(const std::string& filename,
                                              FileDescriptorProto* output) {
  for (int i = 0; i < sources_.size(); i++) {
    if (sources_[i]->FindFileByName(filename, output)) {
      return true;
    }
  }
  return false;
}